

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_read_plain(curl_socket_t sockfd,char *buf,size_t bytesfromsocket,ssize_t *n)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  CURLcode CVar4;
  
  CVar4 = CURLE_OK;
  sVar2 = recv(sockfd,buf,bytesfromsocket,0);
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    CVar4 = CURLE_RECV_ERROR;
    if (iVar1 == 4) {
      CVar4 = CURLE_AGAIN;
    }
    *n = 0;
    if (iVar1 == 0xb) {
      CVar4 = CURLE_AGAIN;
    }
  }
  else {
    *n = sVar2;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_read_plain(curl_socket_t sockfd,
                         char *buf,
                         size_t bytesfromsocket,
                         ssize_t *n)
{
  ssize_t nread = sread(sockfd, buf, bytesfromsocket);

  if(-1 == nread) {
    const int err = SOCKERRNO;
    const bool return_error =
#ifdef USE_WINSOCK
      WSAEWOULDBLOCK == err
#else
      EWOULDBLOCK == err || EAGAIN == err || EINTR == err
#endif
      ;
    *n = 0; /* no data returned */
    if(return_error)
      return CURLE_AGAIN;
    return CURLE_RECV_ERROR;
  }

  *n = nread;
  return CURLE_OK;
}